

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int is_whole_packet_present(stb_vorbis *f)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  
  uVar7 = f->next_seg;
  uVar8 = (ulong)(int)uVar7;
  puVar5 = f->stream;
  if (uVar8 == 0xffffffffffffffff) {
    bVar4 = true;
    uVar8 = 0xffffffff;
  }
  else {
    uVar2 = f->segment_count;
    if ((int)uVar7 < (int)uVar2) {
      puVar11 = f->segments + uVar8;
      do {
        puVar5 = puVar5 + *puVar11;
        uVar7 = (uint)uVar8;
        if ((ulong)*puVar11 != 0xff) break;
        uVar6 = (uint)uVar8 + 1;
        uVar8 = (ulong)uVar6;
        puVar11 = puVar11 + 1;
        uVar7 = uVar2;
      } while (uVar2 != uVar6);
    }
    if (f->stream_end < puVar5) {
      f->error = VORBIS_need_more_data;
      return 0;
    }
    uVar8 = 0xffffffff;
    if (uVar7 != uVar2) {
      uVar8 = (ulong)uVar7;
    }
    bVar4 = false;
  }
  do {
    if ((int)uVar8 != -1) {
      return 1;
    }
    puVar11 = f->stream_end;
    if (puVar5 + 0x1a < puVar11) {
      if ((*(uint8 (*) [4])puVar5 != ogg_page_header) || ((char)*(int *)(puVar5 + 4) != '\0')) {
        f->error = VORBIS_invalid_stream;
        goto LAB_0015e14b;
      }
      if (bVar4) {
        if ((f->previous_length != 0) && ((puVar5[5] & 1) != 0)) {
          f->error = VORBIS_invalid_stream;
          bVar4 = true;
          goto LAB_0015e14b;
        }
      }
      else if ((puVar5[5] & 1) == 0) {
        f->error = VORBIS_invalid_stream;
        bVar4 = false;
        goto LAB_0015e14b;
      }
      bVar1 = puVar5[0x1a];
      uVar8 = (ulong)bVar1;
      puVar12 = puVar5 + uVar8 + 0x1b;
      if (puVar11 < puVar12) {
        f->error = VORBIS_need_more_data;
        uVar8 = 0xffffffff;
        puVar5 = puVar12;
LAB_0015e1ff:
        bVar3 = false;
      }
      else {
        if (bVar1 == 0) {
          uVar10 = 0;
        }
        else {
          uVar9 = 0;
          do {
            puVar12 = puVar12 + puVar5[uVar9 + 0x1b];
            uVar10 = uVar9;
            if ((ulong)puVar5[uVar9 + 0x1b] != 0xff) break;
            uVar9 = uVar9 + 1;
            uVar10 = uVar8;
          } while (uVar8 != uVar9);
        }
        puVar5 = puVar12;
        uVar8 = uVar10 & 0xffffffff;
        if ((uint)uVar10 == (uint)bVar1) {
          uVar8 = 0xffffffff;
        }
        bVar3 = true;
        if (puVar11 < puVar5) {
          f->error = VORBIS_need_more_data;
          goto LAB_0015e1ff;
        }
        bVar4 = false;
      }
    }
    else {
      f->error = VORBIS_need_more_data;
LAB_0015e14b:
      uVar8 = 0xffffffff;
      bVar3 = false;
    }
    if (!bVar3) {
      return 0;
    }
  } while( true );
}

Assistant:

static int is_whole_packet_present(stb_vorbis *f)
{
   // make sure that we have the packet available before continuing...
   // this requires a full ogg parse, but we know we can fetch from f->stream

   // instead of coding this out explicitly, we could save the current read state,
   // read the next packet with get8() until end-of-packet, check f->eof, then
   // reset the state? but that would be slower, esp. since we'd have over 256 bytes
   // of state to restore (primarily the page segment table)

   int s = f->next_seg, first = TRUE;
   uint8 *p = f->stream;

   if (s != -1) { // if we're not starting the packet with a 'continue on next page' flag
      for (; s < f->segment_count; ++s) {
         p += f->segments[s];
         if (f->segments[s] < 255)               // stop at first short segment
            break;
      }
      // either this continues, or it ends it...
      if (s == f->segment_count)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   for (; s == -1;) {
      uint8 *q;
      int n;

      // check that we have the page header ready
      if (p + 26 >= f->stream_end)               return error(f, VORBIS_need_more_data);
      // validate the page
      if (memcmp(p, ogg_page_header, 4))         return error(f, VORBIS_invalid_stream);
      if (p[4] != 0)                             return error(f, VORBIS_invalid_stream);
      if (first) { // the first segment must NOT have 'continued_packet', later ones MUST
         if (f->previous_length)
            if ((p[5] & PAGEFLAG_continued_packet))  return error(f, VORBIS_invalid_stream);
         // if no previous length, we're resynching, so we can come in on a continued-packet,
         // which we'll just drop
      } else {
         if (!(p[5] & PAGEFLAG_continued_packet)) return error(f, VORBIS_invalid_stream);
      }
      n = p[26]; // segment counts
      q = p+27;  // q points to segment table
      p = q + n; // advance past header
      // make sure we've read the segment table
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      for (s=0; s < n; ++s) {
         p += q[s];
         if (q[s] < 255)
            break;
      }
      if (s == n)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   return TRUE;
}